

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfx2wav.cc
# Opt level: O0

void __thiscall
ConvertorSFX2WAV::ConvertorSFX2WAV(ConvertorSFX2WAV *this,PBuffer *_buffer,int _level,bool _invert)

{
  shared_ptr<Buffer> local_30;
  byte local_1d;
  int local_1c;
  bool _invert_local;
  PBuffer *pPStack_18;
  int _level_local;
  PBuffer *_buffer_local;
  ConvertorSFX2WAV *this_local;
  
  local_1d = _invert;
  local_1c = _level;
  pPStack_18 = _buffer;
  _buffer_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_30,_buffer);
  ConvertorPCM2WAV::ConvertorPCM2WAV(&this->super_ConvertorPCM2WAV,&local_30,1,8000);
  std::shared_ptr<Buffer>::~shared_ptr(&local_30);
  (this->super_ConvertorPCM2WAV).super_Convertor._vptr_Convertor =
       (_func_int **)&PTR__ConvertorSFX2WAV_001a5700;
  this->level = local_1c;
  this->invert = (bool)(local_1d & 1);
  return;
}

Assistant:

ConvertorSFX2WAV::ConvertorSFX2WAV(PBuffer _buffer, int _level, bool _invert)
  : ConvertorPCM2WAV(_buffer, 1, 8000)
  , level(_level)
  , invert(_invert) {
}